

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbmmap.c
# Opt level: O0

uint mmap_addressof(gbspace_t sect)

{
  gbspace_t sect_local;
  uint local_4;
  
  switch(sect) {
  case rom_0:
    local_4 = 0;
    break;
  case rom_n:
    local_4 = 0x4000;
    break;
  case vram:
    local_4 = 0x8000;
    break;
  case ram:
    local_4 = 0xa000;
    break;
  case wram_0:
    local_4 = 0xc000;
    break;
  case wram_n:
    local_4 = 0xd000;
    break;
  case echo:
    local_4 = 0xe000;
    break;
  case oam:
    local_4 = 0xfe00;
    break;
  case unusable:
    local_4 = 0xfea0;
    break;
  case io:
    local_4 = 0xff00;
    break;
  case hram:
    local_4 = 0xff80;
    break;
  case ie:
    local_4 = 0xffff;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned mmap_addressof(gbspace_t sect)
{
    switch (sect)
    {
        case rom_0:    return 0x0000;
        case rom_n:    return 0x4000;
        case vram:     return 0x8000;
        case ram:      return 0xA000;
        case wram_0:   return 0xC000;
        case wram_n:   return 0xD000;
        case echo:     return 0xE000;
        case oam:      return 0xFE00;
        case unusable: return 0xFEA0;
        case io:       return 0xFF00;
        case hram:     return 0xFF80;
        case ie:       return 0xFFFF;
        default:       return 0;
    }
}